

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O2

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::impl::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,uint128 *value)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint128 *puVar8;
  ulong uVar9;
  int_type c;
  long extraout_RDX;
  uint128 *puVar10;
  ulong uVar11;
  anon_class_1_0_00000001 hex_digit_to_uint128;
  
  uVar4 = *(uint *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  std::ws<wchar_t,std::char_traits<wchar_t>>((wistream *)in);
  uVar3 = std::wistream::peek();
  if ((uVar4 & 0x4a) == 8) {
    if ((uVar3 - 0x30 < 10) ||
       ((uVar3 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(uVar3 - 0x41) & 0x3f) & 1) != 0)))) {
      iVar5 = 1;
      uVar7 = 0;
      puVar10 = (uint128 *)0x0;
      do {
        iVar6 = std::wistream::peek();
        if ((iVar6 - 0x30U < 10) ||
           ((iVar6 - 0x41U < 0x26 && ((0x3f0000003fU >> ((ulong)(iVar6 - 0x41U) & 0x3f) & 1) != 0)))
           ) {
          if (iVar5 == 0) goto LAB_001af5d9;
LAB_001af5f3:
          if (uVar7 >> 0x3c != 0) break;
          uVar9 = (long)puVar10 * 0x10;
          uVar4 = std::wistream::get();
          puVar8 = operator>><wchar_t,_std::char_traits<wchar_t>,_trng::optimized_impl::uint128>::
                   anon_class_1_0_00000001::operator()
                             ((uint128 *)&hex_digit_to_uint128,
                              (anon_class_1_0_00000001 *)(ulong)uVar4,c);
          uVar11 = (ulong)puVar10 >> 0x3c;
          puVar10 = puVar8 + (long)puVar10;
          uVar7 = (uVar7 << 4 | uVar11) + extraout_RDX + (ulong)CARRY8((ulong)puVar8,uVar9);
        }
        else {
          if ((iVar5 != 0) || (uVar4 = std::wistream::peek(), (uVar4 & 0xffffffdf) != 0x58)) {
            *(uint128 **)&value->value = puVar10;
            goto LAB_001af702;
          }
LAB_001af5d9:
          uVar4 = std::wistream::peek();
          if ((uVar4 & 0xffffffdf) != 0x58) goto LAB_001af5f3;
          std::wistream::get();
        }
        iVar5 = iVar5 + -1;
      } while( true );
    }
  }
  else if ((uVar4 & 0x4a) == 0x40) {
    if ((uVar3 & 0xfffffff8) == 0x30) {
      uVar7 = 0;
      uVar11 = 0;
      while( true ) {
        uVar4 = std::wistream::peek();
        if ((uVar4 & 0xfffffff8) != 0x30) {
          *(ulong *)&value->value = uVar7;
          *(ulong *)((long)&value->value + 8) = uVar11;
          return in;
        }
        if (uVar11 >> 0x3d != 0) break;
        uVar9 = uVar7 * 8;
        iVar5 = std::wistream::get();
        uVar2 = uVar7 >> 0x3d;
        uVar7 = (iVar5 - 0x30) + uVar9;
        uVar11 = (uVar11 << 3 | uVar2) + (ulong)CARRY8((ulong)(iVar5 - 0x30),uVar9);
      }
    }
  }
  else if (uVar3 - 0x30 < 10) {
    uVar11 = 0;
    uVar7 = 0;
    do {
      iVar5 = std::wistream::peek();
      if (9 < iVar5 - 0x30U) {
        *(ulong *)&value->value = uVar11;
LAB_001af702:
        *(ulong *)((long)&value->value + 8) = uVar7;
        return in;
      }
      if (0x1999999999999998 < uVar7 &&
          (ulong)(uVar11 < 0x999999999999999a) <= uVar7 + 0xe666666666666667) break;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar11;
      uVar9 = SUB168(auVar1 * ZEXT816(10),0);
      uVar7 = uVar7 * 10 + SUB168(auVar1 * ZEXT816(10),8);
      iVar5 = std::wistream::get();
      uVar4 = iVar5 - 0x30;
      if (~uVar7 < (ulong)(~uVar9 < (ulong)uVar4)) break;
      uVar11 = uVar9 + uVar4;
      uVar7 = uVar7 + CARRY8(uVar9,(ulong)uVar4);
    } while( true );
  }
  std::wios::setstate((int)*(undefined8 *)(*(long *)in + -0x18) + (int)in);
  return in;
}

Assistant:

std::basic_istream<T,
        TRAIT> &operator>>(std::basic_istream<T,
        TRAIT> &in, UINT128 &value) {
      const auto stream_flags{in.flags()};

      const auto is_dec_digit = [](typename TRAIT::int_type c) -> bool {
        return T('0') <= c and c <= T('9');
      };
      const auto dec_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
      };

      const auto is_oct_digit = [](typename TRAIT::int_type c) -> bool {
        return T('0') <= c and c <= T('7');
      };
      const auto oct_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
      };

      const auto is_hex_digit = [](typename TRAIT::int_type c) -> bool {
        return (T('0') <= c and c <= T('9')) or (T('a') <= c and c <= T('f')) or
               (T('A') <= c and c <= T('F'));
      };
      const auto is_hex_basechar = [](typename TRAIT::int_type c) -> bool {
        return c == T('x') or c == T('X');
      };
      const auto hex_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        if (T('0') <= c and c <= T('9'))
          return static_cast<UINT128>(
              static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
        if (T('a') <= c and c <= T('f'))
          return static_cast<UINT128>(
              static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('a') + 10));
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('A') + 10));
      };

      in >> std::ws;

      switch (stream_flags & std::ios_base::basefield) {
        case std::ios_base::oct: {
          const UINT128 mult_overflow{0x2000000000000000, 0x000000000000000};  // 2^128 / 8
          if (not is_oct_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          while (is_oct_digit(in.peek())) {
            if (result >= mult_overflow) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result *= static_cast<UINT128>(static_cast<std::uint64_t>(8));
            result += oct_digit_to_uint128(in.get());
          }
          value = result;
        }
          break;
        case std::ios_base::dec:
        default: {
          const UINT128 mult_overflow{0x1999999999999999,
                                      0x999999999999999a};  // ceil(2^128 / 10)
          const UINT128 max{0xffffffffffffffff, 0xffffffffffffffff};  // 2^128 - 1
          if (not is_dec_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          while (is_dec_digit(in.peek())) {
            if (result >= mult_overflow) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result *= static_cast<UINT128>(static_cast<std::uint64_t>(10));
            const auto next_digit{dec_digit_to_uint128(in.get())};
            if (next_digit > max - result) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result += next_digit;
          }
          value = result;
        }
          break;
        case std::ios_base::hex: {
          const UINT128 mult_overflow{0x1000000000000000, 0x000000000000000};  // 2^128 / 16
          if (not is_hex_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          int pos{0};
          while (is_hex_digit(in.peek()) or (pos == 1 and is_hex_basechar(in.peek()))) {
            if (pos == 1 and is_hex_basechar(in.peek())) {
              in.get();
            } else {
              if (result >= mult_overflow) {
                in.setstate(std::ios_base::failbit);
                return in;
              }
              result *= static_cast<UINT128>(static_cast<std::uint64_t>(16));
              result += hex_digit_to_uint128(in.get());
            }
            ++pos;
          }
          value = result;
        }
          break;
      }

      return in;
    }